

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

bool amrex::anon_unknown_12::anon_unknown_0::squeryval<double>
               (Table *table,string *name,double *ptr,int ival,int occurrence)

{
  bool bVar1;
  PP_entry *pp;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  char *pcVar5;
  int in_ECX;
  int in_R8D;
  string *unaff_retaddr;
  int in_stack_0000000c;
  bool ok;
  string *valname;
  PP_entry *def;
  double *in_stack_00000170;
  string *in_stack_00000178;
  int iVar6;
  bool local_11;
  undefined8 in_stack_fffffffffffffff8;
  
  pp = ppindex((Table *)valname,in_stack_0000000c,unaff_retaddr,
               SUB81((ulong)in_stack_fffffffffffffff8 >> 0x38,0));
  if (pp == (PP_entry *)0x0) {
    local_11 = false;
  }
  else {
    iVar6 = in_ECX;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pp->m_vals);
    if ((int)sVar2 <= in_ECX) {
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,"ParmParse::queryval no value number");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      std::operator<<(poVar3," for ");
      if (in_R8D == -1) {
        poVar3 = ErrorStream();
        std::operator<<(poVar3,"last occurrence of ");
      }
      else {
        poVar3 = ErrorStream();
        poVar3 = std::operator<<(poVar3," occurrence ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R8D);
        std::operator<<(poVar3," of ");
      }
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,(string *)pp);
      std::operator<<(poVar3,'\n');
      poVar3 = amrex::operator<<((ostream *)CONCAT44(iVar6,in_R8D),pp);
      std::operator<<(poVar3,'\n');
      Abort_host((char *)pp);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&pp->m_vals,(long)iVar6);
    bVar1 = is<double>(in_stack_00000178,in_stack_00000170);
    if (!bVar1) {
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,"ParmParse::queryval type mismatch on value number ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      poVar3 = std::operator<<(poVar3," of ");
      std::operator<<(poVar3,'\n');
      if (in_R8D == -1) {
        poVar3 = ErrorStream();
        std::operator<<(poVar3," last occurrence of ");
      }
      else {
        poVar3 = ErrorStream();
        poVar3 = std::operator<<(poVar3," occurrence number ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R8D);
        std::operator<<(poVar3," of ");
      }
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,(string *)pp);
      std::operator<<(poVar3,'\n');
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3," Expected an \"");
      pcVar5 = tok_name<double>((double *)0xf0ea95);
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"\" type  which can\'t be parsed from the string \"");
      poVar3 = std::operator<<(poVar3,(string *)pvVar4);
      std::operator<<(poVar3,"\"\n");
      poVar3 = amrex::operator<<((ostream *)CONCAT44(iVar6,in_R8D),pp);
      std::operator<<(poVar3,'\n');
      Abort_host((char *)pp);
    }
    local_11 = true;
  }
  return local_11;
}

Assistant:

bool
squeryval (const ParmParse::Table& table,
           const std::string& name,
           T&           ptr,
           int          ival,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry* def = ppindex(table, occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have ival values?
    //
    if ( ival >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryval no value number"
                  << ival << " for ";
        if ( occurrence ==  ParmParse::LAST )
        {
            amrex::ErrorStream() << "last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }

    const std::string& valname = def->m_vals[ival];

    bool ok = is(valname, ptr);
    if ( !ok )
    {
        amrex::ErrorStream() << "ParmParse::queryval type mismatch on value number "
                  << ival << " of " << '\n';
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n';
        amrex::ErrorStream() << " Expected an \""
                  << tok_name(ptr)
                  << "\" type  which can't be parsed from the string \""
                  << valname << "\"\n"
                  << *def << '\n';
        amrex::Abort();
    }
    return true;
}